

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O3

bool __thiscall
nuraft::FakeNetwork::makeReqFail(FakeNetwork *this,string *endpoint,bool random_order)

{
  _List_node_base *__args_1;
  iterator __position;
  SimpleLogger *this_00;
  pointer pcVar1;
  pointer pcVar2;
  undefined8 uVar3;
  msg_type type;
  list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_> *this_01;
  ptr<FakeClient> pVar4;
  undefined1 local_f1;
  string *local_f0;
  ptr<rpc_exception> exp;
  ptr<resp_msg> rsp;
  ptr<FakeClient> conn;
  element_type *local_a8;
  undefined1 local_a0 [112];
  
  pVar4 = findClient((FakeNetwork *)&conn,(string *)this);
  __position._M_node =
       ((conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       pendingReqs).
       super__List_base<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  this_01 = &(conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             pendingReqs;
  if (__position._M_node != (_List_node_base *)this_01) {
    __args_1 = __position._M_node + 1;
    this_00 = ((this->base).super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->myLog;
    local_f0 = endpoint;
    if ((this_00 != (SimpleLogger *)0x0) &&
       (3 < (this_00->curLogLevel).super___atomic_base<int>._M_i)) {
      pcVar1 = (this->myEndpoint)._M_dataplus._M_p;
      pcVar2 = (endpoint->_M_dataplus)._M_p;
      msg_type_to_string_abi_cxx11_
                ((string *)local_a0,
                 (nuraft *)
                 (ulong)(((__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> *)
                         &__args_1->_M_next)->_M_ptr->super_msg_base).type_,
                 (msg_type)
                 pVar4.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      SimpleLogger::put(this_00,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/fake_network.cxx"
                        ,"makeReqFail",0xc6,"[BEGIN] make request %s -> %s failed, %s",pcVar1,pcVar2
                        ,local_a0._0_8_);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 0x10)) {
        operator_delete((void *)local_a0._0_8_);
      }
    }
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a0._104_8_ = "failed to send request to peer %d";
    snprintf((char *)local_a0,100,"failed to send request to peer %d",
             (ulong)(uint)(((__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> *)
                           &__args_1->_M_next)->_M_ptr->super_msg_base).dst_);
    exp.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_a8 = (element_type *)local_a0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::rpc_exception,std::allocator<nuraft::rpc_exception>,char_const*,std::shared_ptr<nuraft::req_msg>&>
              (&exp.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(rpc_exception **)&exp,(allocator<nuraft::rpc_exception> *)&local_f1,
               (char **)&local_a8,(shared_ptr<nuraft::req_msg> *)__args_1);
    if (__position._M_node[3]._M_next == (_List_node_base *)0x0) {
      uVar3 = std::__throw_bad_function_call();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 0x10)) {
        operator_delete((void *)local_a0._0_8_);
      }
      if (exp.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (exp.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      _Unwind_Resume(uVar3);
    }
    (*(code *)__position._M_node[3]._M_prev)(__position._M_node + 2,&rsp,&exp);
    if ((this_00 != (SimpleLogger *)0x0) &&
       (3 < (this_00->curLogLevel).super___atomic_base<int>._M_i)) {
      pcVar1 = (this->myEndpoint)._M_dataplus._M_p;
      pcVar2 = (local_f0->_M_dataplus)._M_p;
      msg_type_to_string_abi_cxx11_
                ((string *)local_a0,
                 (nuraft *)
                 (ulong)(((__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> *)
                         &__args_1->_M_next)->_M_ptr->super_msg_base).type_,type);
      SimpleLogger::put(this_00,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/fake_network.cxx"
                        ,"makeReqFail",0xd2,"[END] make request %s -> %s failed, %s",pcVar1,pcVar2,
                        local_a0._0_8_);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 0x10)) {
        operator_delete((void *)local_a0._0_8_);
      }
    }
    std::__cxx11::list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>::
    _M_erase(this_01,__position);
    if (exp.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (exp.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  if (conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return __position._M_node != (_List_node_base *)this_01;
}

Assistant:

bool FakeNetwork::makeReqFail(const std::string& endpoint,
                              bool random_order)
{
    // this:                    source (sending request)
    // conn->dstNet (endpoint): destination (sending response)
    ptr<FakeClient> conn = findClient(endpoint);

    auto pkg_entry = conn->pendingReqs.begin();
    if (pkg_entry == conn->pendingReqs.end()) return false;

    ReqPkg& pkg = *pkg_entry;

    SimpleLogger* ll = base->getLogger();
    _log_info(ll, "[BEGIN] make request %s -> %s failed, %s",
              myEndpoint.c_str(), endpoint.c_str(),
              msg_type_to_string( pkg.req->get_type() ).c_str() );

    ptr<resp_msg> rsp; // empty.
    ptr<rpc_exception> exp
        ( cs_new<rpc_exception>
          ( sstrfmt( "failed to send request to peer %d" )
                   .fmt( pkg.req->get_dst() ),
            pkg.req ) );
    pkg.whenDone( rsp, exp );

    _log_info(ll, "[END] make request %s -> %s failed, %s",
              myEndpoint.c_str(), endpoint.c_str(),
              msg_type_to_string( pkg.req->get_type() ).c_str() );

    conn->pendingReqs.erase(pkg_entry);
    return true;
}